

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_astat(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  AREA_DATA_conflict *area;
  AREA_AFFECT_DATA *pAVar2;
  bool bVar3;
  uint uVar4;
  undefined8 uVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  AREA_DATA_conflict *area2;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  char buf [4608];
  
  area = ch->in_room->area;
  if (area == (AREA_DATA_conflict *)0x0) {
    send_to_char("Error: No current area (!!)",ch);
    return;
  }
  sprintf(buf,"Area Name: %s\n\r",area->name);
  send_to_char(buf,ch);
  sprintf(buf,"Author: %s\n\r",area->credits);
  send_to_char(buf,ch);
  sprintf(buf,"Filename: %s\n\r",area->file_name);
  send_to_char(buf,ch);
  sprintf(buf,"Vnum range: %d to %d\n\r",(ulong)(uint)(int)area->min_vnum,
          (ulong)(uint)(int)area->max_vnum);
  send_to_char(buf,ch);
  sprintf(buf,"Recommended levels: %d to %d\n\r",(ulong)(uint)(int)area->low_range,
          (ulong)(uint)(int)area->high_range);
  send_to_char(buf,ch);
  sprintf(buf,"Area \'age\': %d  [Area repops when age = 30, or 6 if empty.]\n\r",
          (ulong)(uint)(int)area->age);
  send_to_char(buf,ch);
  sprintf(buf,"Number of players in area: %d\n\r",(ulong)(uint)(int)area->nplayer);
  send_to_char(buf,ch);
  sprintf(buf,"Climate: %s\n\r",climate_table[area->climate].name);
  send_to_char(buf,ch);
  builtin_strncpy(buf,"Current temperature: ",0x16);
  send_to_char(buf,ch);
  switch(area->temp) {
  case 0:
    builtin_strncpy(buf,"Hot\n\r",6);
    break;
  case 1:
    builtin_strncpy(buf,"Warm\n\r",7);
    break;
  case 2:
    builtin_strncpy(buf,"Cool\n\r",7);
    break;
  case 3:
    builtin_strncpy(buf,"Cold\n\r",7);
    break;
  default:
    builtin_strncpy(buf,"None (error)\n\r",0xf);
  }
  send_to_char(buf,ch);
  builtin_strncpy(buf,"Current wind conditions: ",0x1a);
  send_to_char(buf,ch);
  switch(area->wind) {
  case 0:
    builtin_strncpy(buf,"Calm\n\r",7);
    break;
  case 1:
    builtin_strncpy(buf,"Breeze\n\r",9);
    break;
  case 2:
    uVar5 = 0xd0a79646e6957;
    goto LAB_002671f0;
  case 3:
    builtin_strncpy(buf,"Gale\n\r",7);
    break;
  default:
    builtin_strncpy(buf + 8,"ror)\n\r",7);
    uVar5 = 0x72652820656e6f4e;
LAB_002671f0:
    buf._0_4_ = (undefined4)uVar5;
    buf._4_2_ = (undefined2)((ulong)uVar5 >> 0x20);
    buf[6] = (char)((ulong)uVar5 >> 0x30);
    buf[7] = (char)((ulong)uVar5 >> 0x38);
  }
  send_to_char(buf,ch);
  uVar10 = buf._22_4_;
  builtin_strncpy(buf,"Current sky conditions: ",0x19);
  buf[0x19] = SUB41(uVar10,3);
  send_to_char(buf,ch);
  switch(area->sky) {
  case 0:
    uVar5 = 0xd0a7261656c43;
    goto LAB_00267319;
  case 1:
    buf[0] = 'P';
    buf[1] = 'a';
    buf[2] = 'r';
    buf[3] = 't';
    uVar10._0_1_ = 'l';
    uVar10._1_1_ = 'y';
    uVar10._2_1_ = ' ';
    uVar10._3_1_ = 'c';
    uVar11._0_1_ = 'l';
    uVar11._1_1_ = 'o';
    uVar11._2_1_ = 'u';
    uVar11._3_1_ = 'd';
    uVar12._0_1_ = 'y';
    uVar12._1_1_ = '\n';
    uVar12._2_1_ = '\r';
    uVar12._3_1_ = '\0';
    goto LAB_002672e9;
  case 2:
    builtin_strncpy(buf,"Overcast\n\r",0xb);
    break;
  case 3:
    builtin_strncpy(buf,"Drizzling\n\r",0xc);
    break;
  case 4:
    builtin_strncpy(buf + 8,"rain\n\r",7);
    uVar5 = 0x20676e6972756f50;
    goto LAB_00267319;
  case 5:
    builtin_strncpy(buf + 8,"torm\n\r",7);
    uVar5 = 0x737265646e756854;
    goto LAB_00267319;
  case 6:
    buf[0] = 'S';
    buf[1] = 'n';
    buf[2] = 'o';
    buf[3] = 'w';
    uVar10._0_1_ = ' ';
    uVar10._1_1_ = 'f';
    uVar10._2_1_ = 'l';
    uVar10._3_1_ = 'u';
    uVar11._0_1_ = 'r';
    uVar11._1_1_ = 'r';
    uVar11._2_1_ = 'i';
    uVar11._3_1_ = 'e';
    uVar12._0_1_ = 's';
    uVar12._1_1_ = '\n';
    uVar12._2_1_ = '\r';
    uVar12._3_1_ = '\0';
LAB_002672e9:
    buf._4_2_ = (undefined2)uVar10;
    buf[6] = SUB41(uVar10,2);
    buf[7] = SUB41(uVar10,3);
    buf[8] = (char)uVar11;
    buf[9] = SUB41(uVar11,1);
    buf[10] = SUB41(uVar11,2);
    buf[0xb] = SUB41(uVar11,3);
    buf._12_2_ = (undefined2)uVar12;
    buf[0xe] = SUB41(uVar12,2);
    buf[0xf] = '\0';
    break;
  case 7:
    builtin_strncpy(buf,"Blizzard\n\r",0xb);
    break;
  case 8:
    builtin_strncpy(buf,"Hail\n\r",7);
    break;
  default:
    builtin_strncpy(buf + 8,"ror)\n\r",7);
    uVar5 = 0x72652820656e6f4e;
LAB_00267319:
    buf._0_4_ = (undefined4)uVar5;
    buf._4_2_ = (undefined2)((ulong)uVar5 >> 0x20);
    buf[6] = (char)((ulong)uVar5 >> 0x30);
    buf[7] = (char)((ulong)uVar5 >> 0x38);
  }
  send_to_char(buf,ch);
  send_to_char("Adjacent areas:",ch);
  if (area_first == (AREA_DATA_conflict *)0x0) {
    pcVar7 = " None.\n\r";
  }
  else {
    iVar6 = 0;
    area2 = area_first;
    do {
      bVar3 = is_adjacent_area(area,area2);
      if (bVar3) {
        send_to_char(" ",ch);
        send_to_char(area2->name,ch);
        iVar6 = iVar6 + 1;
      }
      area2 = area2->next;
    } while (area2 != (AREA_DATA_conflict *)0x0);
    pcVar7 = ".\n\r";
    if (iVar6 == 0) {
      pcVar7 = " None.\n\r";
    }
  }
  send_to_char(pcVar7,ch);
  if (area->affected == (AREA_AFFECT_DATA *)0x0) {
    send_to_char("The area is not affected by anything.\n\r",ch);
  }
  else {
    send_to_char("The area is affected by:\n\r",ch);
    for (pAVar2 = area->affected; pAVar2 != (AREA_AFFECT_DATA *)0x0; pAVar2 = pAVar2->next) {
      uVar4 = pAVar2->aftype - 1;
      pcVar7 = "Spell: \'%s\' ";
      if (uVar4 < 4) {
        pcVar7 = &DAT_003887d8 + *(int *)(&DAT_003887d8 + (ulong)uVar4 * 4);
      }
      sprintf(buf,pcVar7,skill_table[pAVar2->type].name);
      send_to_char(buf,ch);
      pcVar7 = aaffect_loc_name(0);
      sVar1 = pAVar2->duration;
      if (sVar1 == -1) {
        uVar8 = 0xffffffff;
      }
      else {
        uVar8 = (ulong)(uint)((int)(short)(sVar1 - (sVar1 >> 0xf)) >> 1);
      }
      pcVar9 = "none";
      if (pAVar2->owner != (CHAR_DATA *)0x0) {
        pcVar9 = pAVar2->owner->name;
      }
      sprintf(buf,"modifies %s by %d for %d hours with %s-bits %s, owner %s, level %d.\n\r",pcVar7,
              (ulong)(uint)(int)pAVar2->modifier,uVar8,"flag","nullptr",pcVar9,
              (ulong)(uint)(int)pAVar2->level);
      send_to_char(buf,ch);
    }
  }
  return;
}

Assistant:

void do_astat(CHAR_DATA *ch, char *argument)
{
	char buf[MSL];
	int count = 0;
	AREA_DATA *area, *pArea;
	AREA_AFFECT_DATA *paf;

	area = ch->in_room->area;

	if (!area)
	{
		send_to_char("Error: No current area (!!)", ch);
		return;
	}

	sprintf(buf, "Area Name: %s\n\r", area->name);
	send_to_char(buf, ch);

	sprintf(buf, "Author: %s\n\r", area->credits);
	send_to_char(buf, ch);

	sprintf(buf, "Filename: %s\n\r", area->file_name);
	send_to_char(buf, ch);

	sprintf(buf, "Vnum range: %d to %d\n\r", area->min_vnum, area->max_vnum);
	send_to_char(buf, ch);

	sprintf(buf, "Recommended levels: %d to %d\n\r", area->low_range, area->high_range);
	send_to_char(buf, ch);

	sprintf(buf, "Area 'age': %d  [Area repops when age = 30, or 6 if empty.]\n\r", area->age);
	send_to_char(buf, ch);

	sprintf(buf, "Number of players in area: %d\n\r", area->nplayer);
	send_to_char(buf, ch);

	sprintf(buf, "Climate: %s\n\r", climate_table[area->climate].name);
	send_to_char(buf, ch);

	sprintf(buf, "Current temperature: ");
	send_to_char(buf, ch);

	switch (area->temp)
	{
		case Temperature::Hot:
			sprintf(buf, "Hot\n\r");
			break;
		case Temperature::Warm:
			sprintf(buf, "Warm\n\r");
			break;
		case Temperature::Cool:
			sprintf(buf, "Cool\n\r");
			break;
		case Temperature::Cold:
			sprintf(buf, "Cold\n\r");
			break;
		default:
			sprintf(buf, "None (error)\n\r");
	}

	send_to_char(buf, ch);

	sprintf(buf, "Current wind conditions: ");
	send_to_char(buf, ch);

	switch (area->wind)
	{
		case Windspeed::Calm:
			sprintf(buf, "Calm\n\r");
			break;
		case Windspeed::Breeze:
			sprintf(buf, "Breeze\n\r");
			break;
		case Windspeed::Windy:
			sprintf(buf, "Windy\n\r");
			break;
		case Windspeed::Gale:
			sprintf(buf, "Gale\n\r");
			break;
		default:
			sprintf(buf, "None (error)\n\r");
	}

	send_to_char(buf, ch);

	sprintf(buf, "Current sky conditions: ");
	send_to_char(buf, ch);

	switch (area->sky)
	{
		case WeatherCondition::Clear:
			sprintf(buf, "Clear\n\r");
			break;
		case WeatherCondition::PartlyCloudy:
			sprintf(buf, "Partly cloudy\n\r");
			break;
		case WeatherCondition::Overcast:
			sprintf(buf, "Overcast\n\r");
			break;
		case WeatherCondition::Drizzle:
			sprintf(buf, "Drizzling\n\r");
			break;
		case WeatherCondition::Downpour:
			sprintf(buf, "Pouring rain\n\r");
			break;
		case WeatherCondition::ThunderStorm:
			sprintf(buf, "Thunderstorm\n\r");
			break;
		case WeatherCondition::SnowFlurry:
			sprintf(buf, "Snow flurries\n\r");
			break;
		case WeatherCondition::Blizzard:
			sprintf(buf, "Blizzard\n\r");
			break;
		case WeatherCondition::Hail:
			sprintf(buf, "Hail\n\r");
			break;
		default:
			sprintf(buf, "None (error)\n\r");
	}

	send_to_char(buf, ch);
	send_to_char("Adjacent areas:", ch);

	for (pArea = area_first; pArea; pArea = pArea->next)
	{
		if (is_adjacent_area(area, pArea))
		{
			send_to_char(" ", ch);
			send_to_char(pArea->name, ch);
			count++;
		}
	}

	if (count == 0)
		send_to_char(" None.\n\r", ch);
	else
		send_to_char(".\n\r", ch);

	if (area->affected)
	{
		send_to_char("The area is affected by:\n\r", ch);

		for (paf = area->affected; paf; paf = paf->next)
		{
			if (paf->aftype == AFT_SKILL)
				sprintf(buf, "Skill: '%s' ", skill_table[paf->type].name);
			else if (paf->aftype == AFT_POWER)
				sprintf(buf, "Power: '%s' ", skill_table[paf->type].name);
			else if (paf->aftype == AFT_COMMUNE)
				sprintf(buf, "Commune: '%s' ", skill_table[paf->type].name);
			else
				sprintf(buf, "Spell: '%s' ", skill_table[paf->type].name);

			send_to_char(buf, ch);

			sprintf(buf, "modifies %s by %d for %d hours with %s-bits %s, owner %s, level %d.\n\r",
				aaffect_loc_name(paf->location),
				paf->modifier,
				(paf->duration == -1) ? paf->duration : paf->duration / 2,
				"flag",
				"nullptr",
				paf->owner != nullptr ? paf->owner->name : "none",
				paf->level);
			send_to_char(buf, ch);
		}
	}
	else
	{
		send_to_char("The area is not affected by anything.\n\r", ch);
	}
}